

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.h
# Opt level: O0

void __thiscall mprpc::MsgPackPacker::pack_map_item(MsgPackPacker *this,char *key,uint64_t val)

{
  uint64_t val_local;
  char *key_local;
  MsgPackPacker *this_local;
  
  pack_string(this,key,0);
  pack_uint64(this,val);
  return;
}

Assistant:

inline void pack_map_item(const char* key, uint64_t val)
        {
            pack_string(key);
            pack_uint64(val);
        }